

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

string * valueAsString<bool>(string *__return_storage_ptr__,bool value)

{
  char *pcVar1;
  allocator local_12;
  undefined1 local_11;
  string *psStack_10;
  bool value_local;
  
  pcVar1 = "FALSE";
  if (value) {
    pcVar1 = "TRUE";
  }
  local_11 = value;
  psStack_10 = __return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,&local_12);
  std::allocator<char>::~allocator((allocator<char> *)&local_12);
  return __return_storage_ptr__;
}

Assistant:

std::string valueAsString<bool>(bool value)
{
  return value ? "TRUE" : "FALSE";
}